

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

void fp::API::moveForward(void)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  string response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"moveForward");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&local_28);
  bVar1 = std::operator!=(&local_28,"ack");
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&local_28);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_28);
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar3 = __cxa_rethrow();
  std::__cxx11::string::~string((string *)&local_28);
  _Unwind_Resume(uVar3);
}

Assistant:

void fp::API::moveForward() {
    std::cout << "moveForward" << std::endl;
    std::string response;
    std::cin >> response;
    if (response != "ack") {
        std::cerr << response << std::endl;
        throw;
    }
}